

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

lys_submodule * yang_read_submodule(lys_module *module,char *data,uint size,unres_schema *unres)

{
  LY_ERR LVar1;
  int iVar2;
  lys_module *module_00;
  LY_ERR *pLVar3;
  unres_schema *local_40;
  unres_schema *unres_local;
  lys_node *node;
  
  unres_local = (unres_schema *)0x0;
  local_40 = unres;
  module_00 = (lys_module *)calloc(1,0xa8);
  if (module_00 == (lys_module *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_submodule");
  }
  else {
    module_00->ctx = module->ctx;
    module_00->field_0x40 = 1;
    module_00->data = (lys_node *)module;
    iVar2 = lyp_check_circmod_add(module_00);
    if (iVar2 == 0) {
      iVar2 = yang_parse_mem(module,(lys_submodule *)module_00,unres,data,size,
                             (lys_node **)&unres_local);
      if (iVar2 == 0) {
        lyp_sort_revisions(module_00);
        iVar2 = yang_check_sub_module(module_00,unres,(lys_node *)unres_local);
        if (iVar2 == 0) {
          lyp_check_circmod_pop(module->ctx);
          if (ly_log_level < '\x02') {
            return (lys_submodule *)module_00;
          }
          ly_log(LY_LLVRB,"Submodule \"%s\" successfully parsed.",module_00->name);
          return (lys_submodule *)module_00;
        }
      }
      else {
        free_yang_common(module_00,(lys_node *)unres_local);
      }
    }
  }
  unres_schema_free(module_00,&local_40);
  if ((module_00 == (lys_module *)0x0) || (module_00->name == (char *)0x0)) {
    free(module_00);
    pLVar3 = ly_errno_location();
    if (*pLVar3 != LY_SUCCESS) {
      pLVar3 = ly_errno_location();
      LVar1 = *pLVar3;
      pLVar3 = ly_errno_location();
      *pLVar3 = LVar1;
    }
    ly_log(LY_LLERR,"Submodule parsing failed.");
  }
  else {
    pLVar3 = ly_errno_location();
    if (*pLVar3 != LY_SUCCESS) {
      pLVar3 = ly_errno_location();
      LVar1 = *pLVar3;
      pLVar3 = ly_errno_location();
      *pLVar3 = LVar1;
    }
    ly_log(LY_LLERR,"Submodule \"%s\" parsing failed.",module_00->name);
    lyp_check_circmod_pop(module->ctx);
    lys_sub_module_remove_devs_augs(module_00);
    lys_submodule_module_data_free((lys_submodule *)module_00);
    lys_submodule_free((lys_submodule *)module_00,(_func_void_lys_node_ptr_void_ptr *)0x0);
  }
  return (lys_submodule *)0x0;
}

Assistant:

struct lys_submodule *
yang_read_submodule(struct lys_module *module, const char *data, unsigned int size, struct unres_schema *unres)
{
    struct lys_submodule *submodule;
    struct lys_node *node = NULL;

    submodule = calloc(1, sizeof *submodule);
    if (!submodule) {
        LOGMEM;
        goto error;
    }

    submodule->ctx = module->ctx;
    submodule->type = 1;
    submodule->belongsto = module;

    /* add into the list of processed modules */
    if (lyp_check_circmod_add((struct lys_module *)submodule)) {
        goto error;
    }

    /* module cannot be changed in this case and 1 cannot be returned */
    if (yang_parse_mem(module, submodule, unres, data, size, &node)) {
        free_yang_common((struct lys_module *)submodule, node);
        goto error;
    }

    lyp_sort_revisions((struct lys_module *)submodule);

    if (yang_check_sub_module((struct lys_module *)submodule, unres, node)) {
        goto error;
    }

    lyp_check_circmod_pop(module->ctx);

    LOGVRB("Submodule \"%s\" successfully parsed.", submodule->name);
    return submodule;

error:
    /* cleanup */
    unres_schema_free((struct lys_module *)submodule, &unres);

    if (!submodule || !submodule->name) {
        free(submodule);
        LOGERR(ly_errno, "Submodule parsing failed.");
        return NULL;
    }

    LOGERR(ly_errno, "Submodule \"%s\" parsing failed.", submodule->name);

    lyp_check_circmod_pop(module->ctx);
    lys_sub_module_remove_devs_augs((struct lys_module *)submodule);
    lys_submodule_module_data_free(submodule);
    lys_submodule_free(submodule, NULL);
    return NULL;
}